

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O0

void __thiscall HttpClient::HttpClient(HttpClient *this,Log *log)

{
  Log *log_local;
  HttpClient *this_local;
  
  Log::Log(&this->_log);
  Log::operator=(&this->_log,log);
  return;
}

Assistant:

HttpClient::HttpClient(Log log) {
  _log = log;
}